

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cc
# Opt level: O3

int main(int param_1,char **param_2)

{
  _Manager_type p_Var1;
  int extraout_EDX;
  int extraout_EDX_00;
  int __n;
  int __fd;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  signal(2,handleExitSignal);
  __fd = 0x407;
  Server::setPort(&server,0x407);
  p_Var1 = server._handleRead.super__Function_base._M_manager;
  local_28 = server._handleRead.super__Function_base._M_functor;
  server._handleRead.super__Function_base._M_functor = (_Any_data)ZEXT816(0);
  local_18 = server._handleRead.super__Function_base._M_manager;
  server._handleRead.super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::weak_ptr<ClientSocket>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Pseudomanifold[P]SimpleServer/echo.cc:26:18)>
       ::_M_manager;
  local_10 = server._handleRead._M_invoker;
  server._handleRead._M_invoker =
       std::
       _Function_handler<void_(std::weak_ptr<ClientSocket>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Pseudomanifold[P]SimpleServer/echo.cc:26:18)>
       ::_M_invoke;
  __n = extraout_EDX;
  if (p_Var1 != (_Manager_type)0x0) {
    __fd = (int)&local_28;
    (*p_Var1)(&local_28,&local_28,__destroy_functor);
    __n = extraout_EDX_00;
  }
  Server::listen(&server,__fd,__n);
  return 0;
}

Assistant:

int main( int /* argc */, char** /* argv */ )
{
  signal( SIGINT, handleExitSignal );

  server.setPort( 1031 );

  server.onRead( [&] ( std::weak_ptr<ClientSocket> socket )
  {
    if( auto s = socket.lock() )
    {
      auto data = s->read();
      s->write( data );
    }
  } );

  server.listen();

  return 0;
}